

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall PrimitiveTestClass::AddValues(PrimitiveTestClass *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  char *pcVar5;
  uchar *__s;
  short *psVar6;
  unsigned_short *puVar7;
  int *piVar8;
  uint *puVar9;
  long *plVar10;
  unsigned_long *puVar11;
  longlong *plVar12;
  unsigned_long_long *puVar13;
  float *pfVar14;
  double *pdVar15;
  longdouble *plVar16;
  long *plVar17;
  ulong *puVar18;
  ulong *puVar19;
  byte bVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  this->us = 0xffff;
  this->c = -1;
  this->uc = 0xff;
  this->s = -1;
  this->i = 0xfffff;
  this->ui = 0xfffff;
  this->l = 0xfffff;
  this->ul = 0xfffff;
  this->ll = 0xfffff;
  this->ull = 0xfffff;
  this->f = 1.342323;
  this->d = 432.324324324;
  this->ld = (longdouble)423432.3465435435;
  pcVar5 = (char *)operator_new__(0xd);
  this->str = pcVar5;
  builtin_strncpy(pcVar5,"Hello World!",0xd);
  iVar21 = this->SIZE;
  uVar23 = (ulong)iVar21;
  pcVar5 = (char *)operator_new__(uVar23);
  if (uVar23 != 0) {
    memset(pcVar5,0xff,uVar23);
  }
  this->pc = pcVar5;
  __s = (uchar *)operator_new__(uVar23);
  if (iVar21 != 0) {
    memset(__s,0xff,uVar23);
  }
  this->puc = __s;
  psVar6 = FillValues<short*>(this);
  this->ps = psVar6;
  puVar7 = FillValues<unsigned_short*>(this);
  this->pus = puVar7;
  piVar8 = FillValues<int*>(this);
  this->pi = piVar8;
  puVar9 = FillValues<unsigned_int*>(this);
  this->pui = puVar9;
  plVar10 = FillValues<long*>(this);
  this->pl = plVar10;
  puVar11 = FillValues<unsigned_long*>(this);
  this->pul = puVar11;
  plVar12 = FillValues<long_long*>(this);
  this->pll = plVar12;
  puVar13 = FillValues<unsigned_long_long*>(this);
  this->pull = puVar13;
  pfVar14 = FillValues<float*>(this);
  this->pf = pfVar14;
  pdVar15 = FillValues<double*>(this);
  this->pd = pdVar15;
  plVar16 = FillValues<long_double*>(this);
  this->pld = plVar16;
  lVar25 = (long)this->SIZE;
  lVar24 = lVar25 * 0x20;
  uVar23 = 0xffffffffffffffff;
  if (-1 < lVar25) {
    uVar23 = lVar24 + 8;
  }
  plVar10 = (long *)operator_new__(uVar23);
  *plVar10 = lVar25;
  if (lVar25 != 0) {
    plVar17 = plVar10 + 3;
    do {
      plVar17[-2] = (long)plVar17;
      plVar17[-1] = 0;
      *(undefined1 *)plVar17 = 0;
      plVar17 = plVar17 + 4;
      lVar24 = lVar24 + -0x20;
    } while (lVar24 != 0);
  }
  this->pto = (TestArrObj *)(plVar10 + 1);
  if (this->SIZE == 0) {
    bVar20 = 0;
    uVar23 = 0;
  }
  else {
    lVar24 = 0;
    uVar22 = 0;
    do {
      std::__cxx11::string::_M_replace
                ((long)&(this->pto->str)._M_dataplus._M_p + lVar24,0,
                 *(char **)((long)&(this->pto->str)._M_string_length + lVar24),0x135d44);
      uVar22 = uVar22 + 1;
      uVar23 = (ulong)this->SIZE;
      lVar24 = lVar24 + 0x20;
    } while (uVar22 < uVar23);
    bVar20 = (byte)((uint)this->SIZE >> 0x1f);
  }
  uVar22 = 0xffffffffffffffff;
  if (bVar20 == 0) {
    uVar22 = uVar23 << 2;
  }
  piVar8 = (int *)operator_new__(uVar22);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&_Stack_30,piVar8);
  _Var4._M_pi = _Stack_30._M_pi;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = piVar8;
  (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  if (this->SIZE == 0) {
    uVar23 = 0;
    iVar21 = 0;
  }
  else {
    peVar2 = (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar22 = 0;
    do {
      peVar2[uVar22] = 10;
      uVar22 = uVar22 + 1;
      iVar21 = this->SIZE;
      uVar23 = (ulong)iVar21;
    } while (uVar22 < uVar23);
  }
  lVar24 = uVar23 * 0x20;
  uVar22 = 0xffffffffffffffff;
  if (-1 < iVar21) {
    uVar22 = lVar24 + 8;
  }
  puVar18 = (ulong *)operator_new__(uVar22);
  *puVar18 = uVar23;
  if (iVar21 != 0) {
    puVar19 = puVar18 + 3;
    do {
      puVar19[-2] = (ulong)puVar19;
      puVar19[-1] = 0;
      *(undefined1 *)puVar19 = 0;
      puVar19 = puVar19 + 4;
      lVar24 = lVar24 + -0x20;
    } while (lVar24 != 0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestArrObj*,std::default_delete<TestArrObj[]>,std::allocator<void>,void>
            (&_Stack_30);
  _Var4._M_pi = _Stack_30._M_pi;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(puVar18 + 1);
  (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  if (this->SIZE != 0) {
    lVar24 = 0;
    uVar23 = 0;
    do {
      peVar3 = (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::_M_replace
                ((long)&(peVar3->str)._M_dataplus._M_p + lVar24,0,
                 *(char **)((long)&(peVar3->str)._M_string_length + lVar24),0x135d44);
      uVar23 = uVar23 + 1;
      lVar24 = lVar24 + 0x20;
    } while (uVar23 < (ulong)(long)this->SIZE);
  }
  return;
}

Assistant:

void AddValues()
        {
            c = 0xFF;
            uc = 0xFF;
            s = 0xFFFF;
            us = 0xFFFF;
            i = 0xFFFFF;
            ui = 0xFFFFF;
            l = 0xFFFFF;
            ul = 0xFFFFF;
            ll = 0xFFFFF;
            ull = 0xFFFFF;
            f = 1.342323;
            d = 432.324324324;
            ld = 423432.3465435435;

            str = new char[strlen("Hello World!") + 1];
            strcpy(str, "Hello World!");
            str[strlen("Hello World!")] = '\0';

            pc = FillValues<char *>();
            puc = FillValues<unsigned char *>();
            ps = FillValues<short *>();
            pus = FillValues<unsigned short *>();
            pi = FillValues<int *>();
            pui = FillValues<unsigned int *>();
            pl = FillValues<long *>();
            pul = FillValues<unsigned long *>();
            pll = FillValues<long long *>();
            pull = FillValues<unsigned long long *>();
            pf = FillValues<float *>();
            pd = FillValues<double *>();
            pld = FillValues<long double *>();

            pto = new TestArrObj[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                pto[i].SetVal();
            }
            
            spi = shared_ptr<int>(new int[SIZE]);
            for (size_t i = 0; i < SIZE; i++)
            {
                (&*spi)[i] = 10;
            }

            spto = shared_ptr<TestArrObj>(new TestArrObj[SIZE], default_delete<TestArrObj[]>());
            for (size_t i = 0; i < SIZE; i++)
            {
                (&*spto)[i].SetVal();
            }   
        }